

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O1

void __thiscall DeckOfCards::DeckOfCards(DeckOfCards *this)

{
  vector<Cards,_std::allocator<Cards>_> *this_00;
  vector<Cards,_std::allocator<Cards>_> *pvVar1;
  int iVar2;
  string fileName;
  ifstream file;
  long *local_248 [2];
  long local_238 [2];
  long local_228 [4];
  byte abStack_208 [488];
  
  (this->super_GamePieces)._vptr_GamePieces = (_func_int **)&PTR_shuffle_001269a0;
  (this->it)._M_current = (Cards *)0x0;
  this_00 = (vector<Cards,_std::allocator<Cards>_> *)operator_new(0x18);
  (this_00->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->deck = this_00;
  pvVar1 = (vector<Cards,_std::allocator<Cards>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->discardedDeck = pvVar1;
  pvVar1 = (vector<Cards,_std::allocator<Cards>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->specialDeck = pvVar1;
  std::vector<Cards,_std::allocator<Cards>_>::reserve(this_00,8);
  std::vector<Cards,_std::allocator<Cards>_>::reserve(this->specialDeck,2);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"cards2.csv","");
  std::ifstream::ifstream(local_228,(string *)local_248,_S_in);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    iVar2 = 1;
    do {
      setCardFile(this,(ifstream *)local_228,this->specialDeck);
      iVar2 = iVar2 + -1;
    } while (iVar2 == 0);
    while( true ) {
      iVar2 = std::istream::peek();
      if (iVar2 == -1) break;
      setCardFile(this,(ifstream *)local_228,this->deck);
    }
    std::ifstream::close();
    (**(this->super_GamePieces)._vptr_GamePieces)(this);
    (**(this->super_GamePieces)._vptr_GamePieces)(this);
    std::ifstream::~ifstream(local_228);
    if (local_248[0] != local_238) {
      operator_delete(local_248[0],local_238[0] + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error: Cards File failed to open ",0x21);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  exit(1);
}

Assistant:

DeckOfCards::DeckOfCards() {
    deck = new vector<Cards>();
    discardedDeck = new vector<Cards>();
    specialDeck = new vector<Cards>();
    vector<Cards>::iterator it;
    deck->reserve(8); // 64 regular
    specialDeck->reserve(NUMBER_OF_SPECIAL_CARDS); //2 special cards

    // cards2 has full logic implementation of 5 cards, and full details of 30 cards
    std::string  fileName= "cards2.csv";
    ifstream file(fileName);

    if(file) {
        for(int j=0; j<NUMBER_OF_SPECIAL_CARDS; j++){
            setCardFile(file,specialDeck);
        }
        while (file.peek()!=EOF)
        {
            setCardFile(file,deck);
        }
        file.close();
    }
    else{
        cout << "Error: Cards File failed to open " << endl;
        exit(1);
    }
    shuffle();
    shuffle();

}